

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_queue.h
# Opt level: O3

void __thiscall
buffer_queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
~buffer_queue(buffer_queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *this)

{
  long *plVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  long lVar3;
  long *plVar4;
  int iVar5;
  long lVar6;
  
  iVar5 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar5 == 0) {
    pbVar2 = this->b_array;
    if (pbVar2 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      lVar3 = *(long *)((long)&pbVar2[-1].field_2 + 8);
      if (lVar3 != 0) {
        lVar6 = lVar3 << 5;
        do {
          plVar1 = (long *)((long)pbVar2 + lVar6 + -0x10);
          plVar4 = *(long **)((long)&pbVar2[-1]._M_dataplus._M_p + lVar6);
          if (plVar1 != plVar4) {
            operator_delete(plVar4,*plVar1 + 1);
          }
          lVar6 = lVar6 + -0x20;
        } while (lVar6 != 0);
      }
      operator_delete__((void *)((long)&pbVar2[-1].field_2 + 8),lVar3 << 5 | 8);
    }
    pthread_mutex_unlock((pthread_mutex_t *)this);
    std::condition_variable::~condition_variable(&this->b_cond);
    return;
  }
  std::__throw_system_error(iVar5);
}

Assistant:

~buffer_queue()
    {
        lock_guard<mutex> lck (b_mutex);
        if (b_array != NULL)
            delete [] b_array;
    }